

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O3

void __thiscall
cmInstallExportGenerator::cmInstallExportGenerator
          (cmInstallExportGenerator *this,cmExportSet *exportSet,string *destination,
          string *file_permissions,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurations,string *component,MessageLevel message,bool exclude_from_all,
          string filename,string name_space,string cxx_modules_directory,bool exportOld,bool android
          ,bool exportPackageDependencies,cmListFileBacktrace backtrace)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  cmExportInstallFileGenerator *pcVar5;
  undefined8 uVar6;
  cmExportInstallFileGenerator *this_00;
  string local_88;
  string local_68;
  cmListFileBacktrace local_48;
  
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  pcVar4 = (destination->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar4,pcVar4 + destination->_M_string_length);
  pcVar4 = (component->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar4,pcVar4 + component->_M_string_length);
  local_48.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = *(element_type **)name_space.field_2._M_allocated_capacity;
  local_48.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
        (name_space.field_2._M_allocated_capacity + 8);
  *(undefined8 *)(name_space.field_2._M_allocated_capacity + 8) = 0;
  *(undefined8 *)name_space.field_2._M_allocated_capacity = 0;
  cmInstallGenerator::cmInstallGenerator
            (&this->super_cmInstallGenerator,&local_88,configurations,&local_68,message,
             exclude_from_all,false,&local_48);
  if (local_48.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  (this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallExportGenerator_00a92030;
  this->ExportSet = exportSet;
  paVar3 = &(this->FilePermissions).field_2;
  (this->FilePermissions)._M_dataplus._M_p = (pointer)paVar3;
  pcVar4 = (file_permissions->_M_dataplus)._M_p;
  paVar1 = &file_permissions->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar1) {
    uVar6 = *(undefined8 *)((long)&file_permissions->field_2 + 8);
    paVar3->_M_allocated_capacity = paVar1->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->FilePermissions).field_2 + 8) = uVar6;
  }
  else {
    (this->FilePermissions)._M_dataplus._M_p = pcVar4;
    (this->FilePermissions).field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
  }
  (this->FilePermissions)._M_string_length = file_permissions->_M_string_length;
  (file_permissions->_M_dataplus)._M_p = (pointer)paVar1;
  file_permissions->_M_string_length = 0;
  (file_permissions->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->FileName).field_2;
  (this->FileName)._M_dataplus._M_p = (pointer)paVar1;
  psVar2 = (size_type *)(filename._M_dataplus._M_p + 0x10);
  if (*(size_type **)filename._M_dataplus._M_p == psVar2) {
    uVar6 = *(undefined8 *)(filename._M_dataplus._M_p + 0x18);
    paVar1->_M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&(this->FileName).field_2 + 8) = uVar6;
  }
  else {
    (this->FileName)._M_dataplus._M_p = (pointer)*(size_type **)filename._M_dataplus._M_p;
    (this->FileName).field_2._M_allocated_capacity = *psVar2;
  }
  (this->FileName)._M_string_length = *(size_type *)(filename._M_dataplus._M_p + 8);
  *(size_type **)filename._M_dataplus._M_p = psVar2;
  filename._M_dataplus._M_p[8] = '\0';
  filename._M_dataplus._M_p[9] = '\0';
  filename._M_dataplus._M_p[10] = '\0';
  filename._M_dataplus._M_p[0xb] = '\0';
  filename._M_dataplus._M_p[0xc] = '\0';
  filename._M_dataplus._M_p[0xd] = '\0';
  filename._M_dataplus._M_p[0xe] = '\0';
  filename._M_dataplus._M_p[0xf] = '\0';
  filename._M_dataplus._M_p[0x10] = '\0';
  paVar1 = &(this->Namespace).field_2;
  (this->Namespace)._M_dataplus._M_p = (pointer)paVar1;
  psVar2 = (size_type *)(filename._M_string_length + 0x10);
  if (*(size_type **)filename._M_string_length == psVar2) {
    uVar6 = *(undefined8 *)(filename._M_string_length + 0x18);
    paVar1->_M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&(this->Namespace).field_2 + 8) = uVar6;
  }
  else {
    (this->Namespace)._M_dataplus._M_p = (pointer)*(size_type **)filename._M_string_length;
    (this->Namespace).field_2._M_allocated_capacity = *psVar2;
  }
  (this->Namespace)._M_string_length = *(size_type *)(filename._M_string_length + 8);
  *(size_type **)filename._M_string_length = psVar2;
  *(undefined8 *)(filename._M_string_length + 8) = 0;
  *(undefined1 *)(filename._M_string_length + 0x10) = 0;
  paVar1 = &(this->CxxModulesDirectory).field_2;
  (this->CxxModulesDirectory)._M_dataplus._M_p = (pointer)paVar1;
  psVar2 = (size_type *)(filename.field_2._M_allocated_capacity + 0x10);
  if (*(size_type **)filename.field_2._M_allocated_capacity == psVar2) {
    uVar6 = *(undefined8 *)(filename.field_2._M_allocated_capacity + 0x18);
    paVar1->_M_allocated_capacity = *psVar2;
    *(undefined8 *)((long)&(this->CxxModulesDirectory).field_2 + 8) = uVar6;
  }
  else {
    (this->CxxModulesDirectory)._M_dataplus._M_p =
         (pointer)*(size_type **)filename.field_2._M_allocated_capacity;
    (this->CxxModulesDirectory).field_2._M_allocated_capacity = *psVar2;
  }
  (this->CxxModulesDirectory)._M_string_length =
       *(size_type *)(filename.field_2._M_allocated_capacity + 8);
  *(size_type **)filename.field_2._M_allocated_capacity = psVar2;
  *(undefined8 *)(filename.field_2._M_allocated_capacity + 8) = 0;
  *(undefined1 *)(filename.field_2._M_allocated_capacity + 0x10) = 0;
  this->ExportOld = (bool)filename.field_2._M_local_buf[8];
  this->ExportPackageDependencies = name_space._M_string_length._0_1_;
  this->LocalGenerator = (cmLocalGenerator *)0x0;
  (this->TempDir)._M_dataplus._M_p = (pointer)&(this->TempDir).field_2;
  (this->TempDir)._M_string_length = 0;
  (this->TempDir).field_2._M_local_buf[0] = '\0';
  (this->MainImportFile)._M_dataplus._M_p = (pointer)&(this->MainImportFile).field_2;
  (this->MainImportFile)._M_string_length = 0;
  (this->MainImportFile).field_2._M_local_buf[0] = '\0';
  (this->EFGen)._M_t.
  super___uniq_ptr_impl<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmExportInstallFileGenerator_*,_std::default_delete<cmExportInstallFileGenerator>_>
  .super__Head_base<0UL,_cmExportInstallFileGenerator_*,_false>._M_head_impl =
       (cmExportInstallFileGenerator *)0x0;
  if ((char)name_space._M_dataplus._M_p == '\0') {
    this_00 = (cmExportInstallFileGenerator *)operator_new(0x1f0);
    cmExportInstallFileGenerator::cmExportInstallFileGenerator(this_00,this);
  }
  else {
    this_00 = (cmExportInstallFileGenerator *)operator_new(0x1f0);
    cmExportInstallAndroidMKGenerator::cmExportInstallAndroidMKGenerator
              ((cmExportInstallAndroidMKGenerator *)this_00,this);
  }
  pcVar5 = (this->EFGen)._M_t.
           super___uniq_ptr_impl<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmExportInstallFileGenerator_*,_std::default_delete<cmExportInstallFileGenerator>_>
           .super__Head_base<0UL,_cmExportInstallFileGenerator_*,_false>._M_head_impl;
  (this->EFGen)._M_t.
  super___uniq_ptr_impl<cmExportInstallFileGenerator,_std::default_delete<cmExportInstallFileGenerator>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmExportInstallFileGenerator_*,_std::default_delete<cmExportInstallFileGenerator>_>
  .super__Head_base<0UL,_cmExportInstallFileGenerator_*,_false>._M_head_impl = this_00;
  if (pcVar5 != (cmExportInstallFileGenerator *)0x0) {
    (**(code **)((long)(pcVar5->super_cmExportFileGenerator)._vptr_cmExportFileGenerator + 8))();
  }
  cmExportSet::AddInstallation(exportSet,this);
  return;
}

Assistant:

cmInstallExportGenerator::cmInstallExportGenerator(
  cmExportSet* exportSet, std::string const& destination,
  std::string file_permissions, std::vector<std::string> const& configurations,
  std::string const& component, MessageLevel message, bool exclude_from_all,
  std::string filename, std::string name_space,
  std::string cxx_modules_directory, bool exportOld, bool android,
  bool exportPackageDependencies, cmListFileBacktrace backtrace)
  : cmInstallGenerator(destination, configurations, component, message,
                       exclude_from_all, false, std::move(backtrace))
  , ExportSet(exportSet)
  , FilePermissions(std::move(file_permissions))
  , FileName(std::move(filename))
  , Namespace(std::move(name_space))
  , CxxModulesDirectory(std::move(cxx_modules_directory))
  , ExportOld(exportOld)
  , ExportPackageDependencies(exportPackageDependencies)
{
  if (android) {
#ifndef CMAKE_BOOTSTRAP
    this->EFGen = cm::make_unique<cmExportInstallAndroidMKGenerator>(this);
#endif
  } else {
    this->EFGen = cm::make_unique<cmExportInstallFileGenerator>(this);
  }
  exportSet->AddInstallation(this);
}